

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void dense2csc(CUPDLPcsc *csc,CUPDLPdense *dense)

{
  cupdlp_int iRow;
  cupdlp_int iCol;
  cupdlp_int nnz;
  CUPDLPdense *dense_local;
  CUPDLPcsc *csc_local;
  
  csc->nRows = dense->nRows;
  csc->nCols = dense->nCols;
  nnz = 0;
  *csc->colMatBeg = 0;
  for (iCol = 0; iCol < csc->nCols; iCol = iCol + 1) {
    for (iRow = 0; iRow < csc->nRows; iRow = iRow + 1) {
      if ((dense->data[iCol * csc->nRows + iRow] != 0.0) ||
         (NAN(dense->data[iCol * csc->nRows + iRow]))) {
        csc->colMatIdx[nnz] = iRow;
        csc->colMatElem[nnz] = dense->data[iCol * csc->nRows + iRow];
        nnz = nnz + 1;
      }
    }
    csc->colMatBeg[iCol + 1] = nnz;
  }
  csc->nMatElem = nnz;
  return;
}

Assistant:

void dense2csc(CUPDLPcsc *csc, CUPDLPdense *dense) {
  csc->nRows = dense->nRows;
  csc->nCols = dense->nCols;

  cupdlp_int nnz = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iRow = 0;
  csc->colMatBeg[0] = 0;
  for (iCol = 0; iCol < csc->nCols; ++iCol) {
    for (iRow = 0; iRow < csc->nRows; ++iRow) {
      if (dense->data[iCol * csc->nRows + iRow] != 0) {
        csc->colMatIdx[nnz] = iRow;
        csc->colMatElem[nnz] = dense->data[iCol * csc->nRows + iRow];
        ++nnz;
      }
    }
    csc->colMatBeg[iCol + 1] = nnz;
  }

  csc->nMatElem = nnz;

  return;
}